

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O1

unsigned_short __thiscall
bsim::quad_value_bit_vector::to_type<unsigned_short>(quad_value_bit_vector *this)

{
  unsigned_short uVar1;
  short sVar2;
  long lVar3;
  ushort uVar4;
  
  if ((long)this->N < 1) {
    uVar1 = 0;
  }
  else {
    sVar2 = 1;
    lVar3 = 0;
    uVar1 = 0;
    do {
      uVar4 = (ushort)(this->bits).
                      super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar3].value;
      if (1 < uVar4) {
        __assert_fail("(value == 1) || (value == 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0x78,"unsigned char bsim::quad_value::binary_value() const");
      }
      uVar1 = uVar1 + uVar4 * sVar2;
      sVar2 = sVar2 * 2;
      lVar3 = lVar3 + 1;
    } while (this->N != lVar3);
  }
  return uVar1;
}

Assistant:

ConvType to_type() const {
      ConvType tmp = 0;
      ConvType exp = 1;
      for (int i = 0; i < bitLength(); i++) {
        tmp += exp*get(i).binary_value();
        exp *= 2;
      }
      return tmp;
      // ConvType tmp = *(const_cast<ConvType*>((const ConvType*) (&(bits[0]))));
      // //TODO FIXME I am a sketchy hack.
      // ConvType mask = sizeof(ConvType) > bits.size() ? (1<<N)-1 : -1; 
      // return tmp & mask;
    }